

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datefmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::DateFormat::format
          (DateFormat *this,Formattable *obj,UnicodeString *appendTo,FieldPosition *fieldPosition,
          UErrorCode *status)

{
  UBool UVar1;
  Type TVar2;
  int32_t iVar3;
  UDate local_40;
  UDate date;
  UErrorCode *status_local;
  FieldPosition *fieldPosition_local;
  UnicodeString *appendTo_local;
  Formattable *obj_local;
  DateFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  this_local = (DateFormat *)appendTo;
  if (UVar1 == '\0') {
    TVar2 = Formattable::getType(obj);
    if (TVar2 == kDate) {
      local_40 = Formattable::getDate(obj);
    }
    else if (TVar2 == kDouble) {
      local_40 = Formattable::getDouble(obj);
    }
    else {
      if (TVar2 != kLong) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
      }
      iVar3 = Formattable::getLong(obj);
      local_40 = (UDate)iVar3;
    }
    this_local = (DateFormat *)format(this,local_40,appendTo,fieldPosition);
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
DateFormat::format(const Formattable& obj,
                   UnicodeString& appendTo,
                   FieldPosition& fieldPosition,
                   UErrorCode& status) const
{
    if (U_FAILURE(status)) return appendTo;

    // if the type of the Formattable is double or long, treat it as if it were a Date
    UDate date = 0;
    switch (obj.getType())
    {
    case Formattable::kDate:
        date = obj.getDate();
        break;
    case Formattable::kDouble:
        date = (UDate)obj.getDouble();
        break;
    case Formattable::kLong:
        date = (UDate)obj.getLong();
        break;
    default:
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return appendTo;
    }

    // Is this right?
    //if (fieldPosition.getBeginIndex() == fieldPosition.getEndIndex())
    //  status = U_ILLEGAL_ARGUMENT_ERROR;

    return format(date, appendTo, fieldPosition);
}